

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::Tests::Tests(Tests *this,Context *context)

{
  APIErrors *this_00;
  LinkingErrors *this_01;
  Limits *this_02;
  CaptureVertexInterleaved *this_03;
  CaptureGeometryInterleaved *this_04;
  CaptureVertexSeparate *this_05;
  CaptureGeometrySeparate *this_06;
  CheckGetXFBVarying *this_07;
  QueryVertexInterleaved *this_08;
  QueryGeometryInterleaved *this_09;
  QueryVertexSeparate *this_10;
  QueryGeometrySeparate *this_11;
  TestNode *node;
  DiscardGeometry *this_12;
  DrawXFB *this_13;
  DrawXFBFeedback *this_14;
  DrawXFBStream *this_15;
  CaptureSpecialInterleaved *this_16;
  DrawXFBInstanced *this_17;
  DrawXFBStreamInstanced *this_18;
  TestNode *local_d8;
  TestNode *local_c0;
  TestNode *local_b0;
  TestNode *local_a0;
  TestNode *local_80;
  TestNode *local_70;
  TestNode *local_60;
  Context *context_local;
  Tests *this_local;
  
  deqp::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,"transform_feedback","Transform Feedback Test Suite"
            );
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Tests_0322ba50;
  this_00 = (APIErrors *)operator_new(200);
  APIErrors::APIErrors(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (LinkingErrors *)operator_new(0x80);
  LinkingErrors::LinkingErrors(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (Limits *)operator_new(0x80);
  Limits::Limits(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (CaptureVertexInterleaved *)operator_new(0xb0);
  CaptureVertexInterleaved::CaptureVertexInterleaved
            (this_03,(this->super_TestCaseGroup).m_context,"capture_vertex_interleaved_test",
             "Transform Feedback Capture Vertex Interleaved Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (CaptureGeometryInterleaved *)operator_new(0xb8);
  CaptureGeometryInterleaved::CaptureGeometryInterleaved
            (this_04,(this->super_TestCaseGroup).m_context,"capture_geometry_interleaved_test",
             "Transform Feedback Capture Geometry Interleaved Test");
  local_60 = (TestNode *)0x0;
  if (this_04 != (CaptureGeometryInterleaved *)0x0) {
    local_60 = (TestNode *)
               ((long)&this_04->_vptr_CaptureGeometryInterleaved +
               (long)this_04->_vptr_CaptureGeometryInterleaved[-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_60);
  this_05 = (CaptureVertexSeparate *)operator_new(200);
  CaptureVertexSeparate::CaptureVertexSeparate
            (this_05,(this->super_TestCaseGroup).m_context,"capture_vertex_separate_test",
             "Transform Feedback Capture Vertex Separate Test");
  local_70 = (TestNode *)0x0;
  if (this_05 != (CaptureVertexSeparate *)0x0) {
    local_70 = (TestNode *)
               ((long)&this_05->_vptr_CaptureVertexSeparate +
               (long)this_05->_vptr_CaptureVertexSeparate[-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_70);
  this_06 = (CaptureGeometrySeparate *)operator_new(0xe0);
  CaptureGeometrySeparate::CaptureGeometrySeparate
            (this_06,(this->super_TestCaseGroup).m_context,"capture_geometry_separate_test",
             "Transform Feedback Capture Geometry Separate Test");
  local_80 = (TestNode *)0x0;
  if (this_06 != (CaptureGeometrySeparate *)0x0) {
    local_80 = (TestNode *)
               ((long)&(this_06->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
               + (long)(this_06->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
                       [-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_80);
  this_07 = (CheckGetXFBVarying *)operator_new(0x98);
  CheckGetXFBVarying::CheckGetXFBVarying
            (this_07,(this->super_TestCaseGroup).m_context,"get_xfb_varying",
             "Transform Feedback Varying Getters Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (QueryVertexInterleaved *)operator_new(0xb8);
  QueryVertexInterleaved::QueryVertexInterleaved
            (this_08,(this->super_TestCaseGroup).m_context,"query_vertex_interleaved_test",
             "Transform Feedback Query Vertex Interleaved Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (QueryGeometryInterleaved *)operator_new(0xc0);
  QueryGeometryInterleaved::QueryGeometryInterleaved
            (this_09,(this->super_TestCaseGroup).m_context,"query_geometry_interleaved_test",
             "Transform Feedback Query Geometry Interleaved Test");
  local_a0 = (TestNode *)0x0;
  if (this_09 != (QueryGeometryInterleaved *)0x0) {
    local_a0 = (TestNode *)
               ((long)&(this_09->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
               + (long)(this_09->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
                       [-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_a0);
  this_10 = (QueryVertexSeparate *)operator_new(200);
  QueryVertexSeparate::QueryVertexSeparate
            (this_10,(this->super_TestCaseGroup).m_context,"query_vertex_separate_test",
             "Transform Feedback Query Vertex Separate Test");
  local_b0 = (TestNode *)0x0;
  if (this_10 != (QueryVertexSeparate *)0x0) {
    local_b0 = (TestNode *)
               ((long)&(this_10->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
               (long)(this_10->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_b0);
  this_11 = (QueryGeometrySeparate *)operator_new(0xe0);
  QueryGeometrySeparate::QueryGeometrySeparate
            (this_11,(this->super_TestCaseGroup).m_context,"query_geometry_separate_test",
             "Transform Feedback Query Geometry Separate Test");
  local_c0 = (TestNode *)0x0;
  if (this_11 != (QueryGeometrySeparate *)0x0) {
    local_c0 = (TestNode *)
               ((long)&(this_11->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                       _vptr_CaptureGeometryInterleaved +
               (long)(this_11->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                     _vptr_CaptureGeometryInterleaved[-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_c0);
  node = (TestNode *)operator_new(0xb0);
  DiscardVertex::DiscardVertex
            ((DiscardVertex *)node,(this->super_TestCaseGroup).m_context,"discard_vertex_test",
             "Transform Feedback Discard Vertex Test");
  tcu::TestNode::addChild((TestNode *)this,node);
  this_12 = (DiscardGeometry *)operator_new(0xb8);
  DiscardGeometry::DiscardGeometry
            (this_12,(this->super_TestCaseGroup).m_context,"discard_geometry_test",
             "Transform Feedback Discard Geometry Test");
  local_d8 = (TestNode *)0x0;
  if (this_12 != (DiscardGeometry *)0x0) {
    local_d8 = (TestNode *)
               ((long)&(this_12->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
               + (long)(this_12->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
                       [-3]);
  }
  tcu::TestNode::addChild((TestNode *)this,local_d8);
  this_13 = (DrawXFB *)operator_new(0xb0);
  DrawXFB::DrawXFB(this_13,(this->super_TestCaseGroup).m_context,"draw_xfb_test",
                   "Transform Feedback Draw Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  this_14 = (DrawXFBFeedback *)operator_new(0xa0);
  DrawXFBFeedback::DrawXFBFeedback
            (this_14,(this->super_TestCaseGroup).m_context,"draw_xfb_feedbackk_test",
             "Transform Feedback Draw Feedback Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  this_15 = (DrawXFBStream *)operator_new(0xb0);
  DrawXFBStream::DrawXFBStream
            (this_15,(this->super_TestCaseGroup).m_context,"draw_xfb_stream_test",
             "Transform Feedback Draw Stream Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
  this_16 = (CaptureSpecialInterleaved *)operator_new(0x98);
  CaptureSpecialInterleaved::CaptureSpecialInterleaved
            (this_16,(this->super_TestCaseGroup).m_context,"capture_special_interleaved_test",
             "Transform Feedback Capture Special Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
  this_17 = (DrawXFBInstanced *)operator_new(0xa0);
  DrawXFBInstanced::DrawXFBInstanced
            (this_17,(this->super_TestCaseGroup).m_context,"draw_xfb_instanced_test",
             "Transform Feedback Draw Instanced Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
  this_18 = (DrawXFBStreamInstanced *)operator_new(0xa8);
  DrawXFBStreamInstanced::DrawXFBStreamInstanced
            (this_18,(this->super_TestCaseGroup).m_context,"draw_xfb_stream_instanced_test",
             "Transform Feedback Draw Stream Instanced Test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
  return;
}

Assistant:

gl3cts::TransformFeedback::Tests::Tests(deqp::Context& context)
	: TestCaseGroup(context, "transform_feedback", "Transform Feedback Test Suite")
{
	addChild(new TransformFeedback::APIErrors(m_context));
	addChild(new TransformFeedback::LinkingErrors(m_context));
	addChild(new TransformFeedback::Limits(m_context));
	addChild(new TransformFeedback::CaptureVertexInterleaved(m_context, "capture_vertex_interleaved_test",
															 "Transform Feedback Capture Vertex Interleaved Test"));
	addChild(new TransformFeedback::CaptureGeometryInterleaved(m_context, "capture_geometry_interleaved_test",
															   "Transform Feedback Capture Geometry Interleaved Test"));
	addChild(new TransformFeedback::CaptureVertexSeparate(m_context, "capture_vertex_separate_test",
														  "Transform Feedback Capture Vertex Separate Test"));
	addChild(new TransformFeedback::CaptureGeometrySeparate(m_context, "capture_geometry_separate_test",
															"Transform Feedback Capture Geometry Separate Test"));
	addChild(new TransformFeedback::CheckGetXFBVarying(m_context, "get_xfb_varying",
													   "Transform Feedback Varying Getters Test"));
	addChild(new TransformFeedback::QueryVertexInterleaved(m_context, "query_vertex_interleaved_test",
														   "Transform Feedback Query Vertex Interleaved Test"));
	addChild(new TransformFeedback::QueryGeometryInterleaved(m_context, "query_geometry_interleaved_test",
															 "Transform Feedback Query Geometry Interleaved Test"));
	addChild(new TransformFeedback::QueryVertexSeparate(m_context, "query_vertex_separate_test",
														"Transform Feedback Query Vertex Separate Test"));
	addChild(new TransformFeedback::QueryGeometrySeparate(m_context, "query_geometry_separate_test",
														  "Transform Feedback Query Geometry Separate Test"));
	addChild(new TransformFeedback::DiscardVertex(m_context, "discard_vertex_test",
												  "Transform Feedback Discard Vertex Test"));
	addChild(new TransformFeedback::DiscardGeometry(m_context, "discard_geometry_test",
													"Transform Feedback Discard Geometry Test"));
	addChild(new TransformFeedback::DrawXFB(m_context, "draw_xfb_test", "Transform Feedback Draw Test"));
	addChild(new TransformFeedback::DrawXFBFeedback(m_context, "draw_xfb_feedbackk_test",
													"Transform Feedback Draw Feedback Test"));
	addChild(
		new TransformFeedback::DrawXFBStream(m_context, "draw_xfb_stream_test", "Transform Feedback Draw Stream Test"));
	addChild(new TransformFeedback::CaptureSpecialInterleaved(m_context, "capture_special_interleaved_test",
															  "Transform Feedback Capture Special Test"));
	addChild(new TransformFeedback::DrawXFBInstanced(m_context, "draw_xfb_instanced_test",
													 "Transform Feedback Draw Instanced Test"));
	addChild(new TransformFeedback::DrawXFBStreamInstanced(m_context, "draw_xfb_stream_instanced_test",
														   "Transform Feedback Draw Stream Instanced Test"));
}